

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O2

void __thiscall zmq::ipc_listener_t::in_event(ipc_listener_t *this)

{
  socket_base_t *this_00;
  int iVar1;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  int in_ESI;
  endpoint_uri_pair_t eStack_58;
  
  iVar1 = accept(this,in_ESI,in_RDX,in_RCX);
  if (iVar1 != -1) {
    stream_listener_base_t::create_engine(&this->super_stream_listener_base_t,iVar1);
    return;
  }
  this_00 = (this->super_stream_listener_base_t)._socket;
  make_unconnected_bind_endpoint_pair(&eStack_58,&(this->super_stream_listener_base_t)._endpoint);
  iVar1 = zmq_errno();
  socket_base_t::event_accept_failed(this_00,&eStack_58,iVar1);
  endpoint_uri_pair_t::~endpoint_uri_pair_t(&eStack_58);
  return;
}

Assistant:

void zmq::ipc_listener_t::in_event ()
{
    const fd_t fd = accept ();

    //  If connection was reset by the peer in the meantime, just ignore it.
    //  TODO: Handle specific errors like ENFILE/EMFILE etc.
    if (fd == retired_fd) {
        _socket->event_accept_failed (
          make_unconnected_bind_endpoint_pair (_endpoint), zmq_errno ());
        return;
    }

    //  Create the engine object for this connection.
    create_engine (fd);
}